

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mount_point.cpp
# Opt level: O2

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cppcms::mount_point::match_abi_cxx11_
          (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,mount_point *this,char *h,char *s,char *p)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char cVar1;
  bool bVar2;
  cmatch m;
  cmatch local_98;
  value_type local_68;
  string_type local_50;
  
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_string_length = 0;
  this_00 = &__return_storage_ptr__->second;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->first = false;
  cVar1 = booster::regex::empty();
  if ((cVar1 == '\0') && (bVar2 = booster::regex_match<booster::regex>(h,&this->host_,0), !bVar2)) {
    return __return_storage_ptr__;
  }
  if (this->selection_ == match_path_info) {
    cVar1 = booster::regex::empty();
    if ((cVar1 == '\0') &&
       (bVar2 = booster::regex_match<booster::regex>(s,&this->script_name_,0), !bVar2)) {
      return __return_storage_ptr__;
    }
    cVar1 = booster::regex::empty();
    if (cVar1 != '\0') {
      std::__cxx11::string::assign((char *)this_00);
      goto LAB_00241174;
    }
    if (this->group_ == 0) {
      bVar2 = booster::regex_match<booster::regex>(p,&this->path_info_,0);
      if (!bVar2) {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::assign((char *)this_00);
      goto LAB_00241174;
    }
    local_98.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.begin_ = (char *)0x0;
    local_98.end_ = (char *)0x0;
    local_98.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar2 = booster::regex_match<booster::regex>(p,&local_98,&this->path_info_,0);
    if (!bVar2) goto LAB_0024112e;
    booster::match_results<const_char_*>::operator[](&local_68,&local_98,this->group_);
    booster::sub_match<char_const*>::str_abi_cxx11_(&local_50,&local_68);
  }
  else {
    cVar1 = booster::regex::empty();
    if ((cVar1 == '\0') &&
       (bVar2 = booster::regex_match<booster::regex>(p,&this->path_info_,0), !bVar2)) {
      return __return_storage_ptr__;
    }
    cVar1 = booster::regex::empty();
    if (cVar1 != '\0') {
      std::__cxx11::string::assign((char *)this_00);
LAB_00241174:
      __return_storage_ptr__->first = true;
      return __return_storage_ptr__;
    }
    if (this->group_ == 0) {
      bVar2 = booster::regex_match<booster::regex>(s,&this->script_name_,0);
      if (!bVar2) {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::assign((char *)this_00);
      goto LAB_00241174;
    }
    local_98.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.begin_ = (char *)0x0;
    local_98.end_ = (char *)0x0;
    local_98.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar2 = booster::regex_match<booster::regex>(s,&local_98,&this->script_name_,0);
    if (!bVar2) goto LAB_0024112e;
    booster::match_results<const_char_*>::operator[](&local_68,&local_98,this->group_);
    booster::sub_match<char_const*>::str_abi_cxx11_(&local_50,&local_68);
  }
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  __return_storage_ptr__->first = true;
LAB_0024112e:
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&local_98.offsets_.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool,std::string> mount_point::match(char const *h,char const *s,char const *p) const
{
	std::pair<bool,std::string> res;
	res.first = false;

	if(!host_.empty() && !booster::regex_match(h,host_))
		return res;

	if(selection_ == match_path_info) {
		if(!script_name_.empty() && !booster::regex_match(s,script_name_))
			return res;
		if(path_info_.empty()) {
			res.second = p;
			res.first = true;
			return res;
		}
		
		if(group_ == 0) {
			if(!booster::regex_match(p,path_info_))
				return res;
			res.second=p;
			res.first=true;
			return res;
		}
		else {
			booster::cmatch m;
			if(!booster::regex_match(p,m,path_info_))
				return res;
			res.second=m[group_];
			res.first = true;
			return res;
		}
	}
	else {
		if(!path_info_.empty() && !booster::regex_match(p,path_info_))
			return res;
		if(script_name_.empty()) {
			res.second=s;
			res.first = true;
			return res;
		}
		if(group_ == 0) {
			if(!booster::regex_match(s,script_name_))
				return res;
			res.second=s;
			res.first = true;
			return res;
		}
		else {
			booster::cmatch m;
			if(!booster::regex_match(s,m,script_name_))
				return res;
			res.second=m[group_];
			res.first = true;
			return res;
		}
	}
}